

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

WindowHandle create_window(string *title,int x,int y,int w,int h)

{
  WindowHandle __s;
  thread *this;
  condition_variable *pcVar1;
  WindowHandle local_68;
  int local_60;
  int local_5c;
  string *local_58;
  unique_lock<std::mutex> local_50;
  int local_3c;
  int local_38;
  int local_34;
  
  local_60 = h;
  local_58 = title;
  if ((anonymous_namespace)::XThreads_initialized == '\0') {
    XInitThreads();
    (anonymous_namespace)::XThreads_initialized = '\x01';
  }
  __s = (WindowHandle)operator_new(0xd8);
  memset(__s,0,0xd8);
  std::condition_variable::condition_variable(&__s->cv);
  __s->display = (Display *)0x0;
  __s->pix_w = 0;
  __s->pix_h = 0;
  __s->listener = (IWindowListener *)0x0;
  __s->w = 0;
  __s->h = 0;
  __s->im = (XImage *)0x0;
  __s->data = (char *)0x0;
  __s->bytes = (uint32_t *)0x0;
  __s->x = x;
  __s->y = y;
  __s->channels = 0;
  local_3c = local_60;
  __s->initialised = false;
  local_68 = __s;
  local_5c = w;
  local_38 = y;
  local_34 = x;
  this = (thread *)operator_new(8);
  std::thread::
  thread<void(&)(WindowHandleData*,std::__cxx11::string_const&,int,int,int,int),WindowHandleData*&,std::__cxx11::string_const&,int&,int&,int&,int&,void>
            (this,anon_unknown.dwarf_15f85::_create_window_with_message_loop,&local_68,local_58,
             &local_34,&local_38,&local_5c,&local_3c);
  local_50._M_device = &local_68->mt;
  local_50._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_50);
  local_50._M_owns = true;
  if (local_68->initialised == false) {
    pcVar1 = &local_68->cv;
    do {
      std::condition_variable::wait((unique_lock *)pcVar1);
    } while (local_68->initialised == false);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&__s->t,this);
  return __s;
}

Assistant:

WindowHandle create_window(const std::string& title, int x, int y, int w, int h)
  {
#ifdef _WIN32
  WindowHandle handle = new WindowHandleData();
  handle->h_wnd = nullptr;
  handle->bytes = nullptr;
#else
  if (!XThreads_initialized)
    {
    XInitThreads(); // This should be called exactly once at the beginning of an XLib multithreaded application.
    XThreads_initialized = true;
    }
  WindowHandle handle = new WindowHandleData();
  handle->display = nullptr;
  handle->im = nullptr;
  handle->pix_w = 0;
  handle->pix_h = 0;
  handle->data = nullptr;
  handle->bytes = nullptr;
#endif
  handle->listener = nullptr;
  handle->w = 0;
  handle->h = 0;
  handle->x = x;
  handle->y = y;
  handle->channels = 0;
#ifdef _WIN32
  handle->t = _create_threaded_window(&(handle->h_wnd), handle, title, x, y, w, h);
#else
  handle->t = _create_threaded_window(handle, title, x, y, w, h);
#endif
  return handle;
  }